

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

int run_test_fs_readdir_non_existing_dir(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  memset(&opendir_req,0xdb,0x1c0);
  puVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",(uv_fs_cb)0x0);
  eval_a = (int64_t)iVar1;
  eval_b = -2;
  if (eval_a == -2) {
    eval_a = (int64_t)opendir_req.fs_type;
    eval_b = 0x1f;
    if (eval_a == 0x1f) {
      eval_a = opendir_req.result;
      eval_b = -2;
      if (opendir_req.result == -2) {
        if (opendir_req.ptr != (void *)0x0) {
          eval_b = 0;
          pcVar5 = "NULL";
          __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
          pcVar4 = "opendir_req.ptr";
          uVar3 = 0xc2;
          eval_a = (int64_t)opendir_req.ptr;
          goto LAB_001220cd;
        }
        uv_fs_req_cleanup(&opendir_req);
        memset(&opendir_req,0xdb,0x1c0);
        puVar2 = uv_default_loop();
        iVar1 = uv_fs_opendir(puVar2,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = (int64_t)non_existing_opendir_cb_count;
          eval_b = 0;
          if (eval_a == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 1;
              eval_b = (int64_t)non_existing_opendir_cb_count;
              if (eval_b == 1) {
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                eval_a = 0;
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar5 = "uv_loop_close(uv_default_loop())";
                pcVar4 = "0";
                uVar3 = 0xd3;
              }
              else {
                pcVar5 = "non_existing_opendir_cb_count";
                pcVar4 = "1";
                uVar3 = 0xd1;
              }
            }
            else {
              pcVar5 = "0";
              pcVar4 = "r";
              uVar3 = 0xd0;
            }
          }
          else {
            pcVar5 = "0";
            pcVar4 = "non_existing_opendir_cb_count";
            uVar3 = 0xce;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "r";
          uVar3 = 0xcd;
        }
      }
      else {
        pcVar5 = "UV_ENOENT";
        pcVar4 = "opendir_req.result";
        uVar3 = 0xc1;
      }
    }
    else {
      pcVar5 = "UV_FS_OPENDIR";
      pcVar4 = "opendir_req.fs_type";
      uVar3 = 0xc0;
    }
  }
  else {
    pcVar5 = "UV_ENOENT";
    pcVar4 = "r";
    uVar3 = 0xbf;
  }
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_001220cd:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(fs_readdir_non_existing_dir) {
  const char* path;
  int r;

  path = "./non-existing-dir/";

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, NULL);
  ASSERT_EQ(r, UV_ENOENT);
  ASSERT_EQ(opendir_req.fs_type, UV_FS_OPENDIR);
  ASSERT_EQ(opendir_req.result, UV_ENOENT);
  ASSERT_NULL(opendir_req.ptr);
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the async flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    non_existing_opendir_cb);
  ASSERT_OK(r);
  ASSERT_OK(non_existing_opendir_cb_count);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, non_existing_opendir_cb_count);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}